

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000187f50 = 0x2d2d2d2d2d2d2d;
    uRam0000000000187f57._0_1_ = '-';
    uRam0000000000187f57._1_1_ = '-';
    uRam0000000000187f57._2_1_ = '-';
    uRam0000000000187f57._3_1_ = '-';
    uRam0000000000187f57._4_1_ = '-';
    uRam0000000000187f57._5_1_ = '-';
    uRam0000000000187f57._6_1_ = '-';
    uRam0000000000187f57._7_1_ = '-';
    DAT_00187f40 = '-';
    DAT_00187f40_1._0_1_ = '-';
    DAT_00187f40_1._1_1_ = '-';
    DAT_00187f40_1._2_1_ = '-';
    DAT_00187f40_1._3_1_ = '-';
    DAT_00187f40_1._4_1_ = '-';
    DAT_00187f40_1._5_1_ = '-';
    DAT_00187f40_1._6_1_ = '-';
    uRam0000000000187f48 = 0x2d2d2d2d2d2d2d;
    DAT_00187f4f = 0x2d;
    DAT_00187f30 = '-';
    DAT_00187f30_1._0_1_ = '-';
    DAT_00187f30_1._1_1_ = '-';
    DAT_00187f30_1._2_1_ = '-';
    DAT_00187f30_1._3_1_ = '-';
    DAT_00187f30_1._4_1_ = '-';
    DAT_00187f30_1._5_1_ = '-';
    DAT_00187f30_1._6_1_ = '-';
    uRam0000000000187f38._0_1_ = '-';
    uRam0000000000187f38._1_1_ = '-';
    uRam0000000000187f38._2_1_ = '-';
    uRam0000000000187f38._3_1_ = '-';
    uRam0000000000187f38._4_1_ = '-';
    uRam0000000000187f38._5_1_ = '-';
    uRam0000000000187f38._6_1_ = '-';
    uRam0000000000187f38._7_1_ = '-';
    DAT_00187f20 = '-';
    DAT_00187f20_1._0_1_ = '-';
    DAT_00187f20_1._1_1_ = '-';
    DAT_00187f20_1._2_1_ = '-';
    DAT_00187f20_1._3_1_ = '-';
    DAT_00187f20_1._4_1_ = '-';
    DAT_00187f20_1._5_1_ = '-';
    DAT_00187f20_1._6_1_ = '-';
    uRam0000000000187f28._0_1_ = '-';
    uRam0000000000187f28._1_1_ = '-';
    uRam0000000000187f28._2_1_ = '-';
    uRam0000000000187f28._3_1_ = '-';
    uRam0000000000187f28._4_1_ = '-';
    uRam0000000000187f28._5_1_ = '-';
    uRam0000000000187f28._6_1_ = '-';
    uRam0000000000187f28._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000187f18._0_1_ = '-';
    uRam0000000000187f18._1_1_ = '-';
    uRam0000000000187f18._2_1_ = '-';
    uRam0000000000187f18._3_1_ = '-';
    uRam0000000000187f18._4_1_ = '-';
    uRam0000000000187f18._5_1_ = '-';
    uRam0000000000187f18._6_1_ = '-';
    uRam0000000000187f18._7_1_ = '-';
    DAT_00187f5f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}